

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolution.c
# Opt level: O2

void complex_multiply_add(float *dst,float *l,float *r,uint32_t size)

{
  uint uVar1;
  uint uVar2;
  float fVar3;
  float fVar4;
  
  for (uVar1 = 1; uVar2 = uVar1 - 1, uVar2 < size; uVar1 = uVar1 + 2) {
    fVar3 = (float)*(undefined8 *)(r + uVar2);
    fVar4 = (float)((ulong)*(undefined8 *)(r + uVar2) >> 0x20);
    *(ulong *)(dst + uVar2) =
         CONCAT44((float)((ulong)*(undefined8 *)(dst + uVar2) >> 0x20) +
                  l[uVar2] * fVar4 + fVar3 * l[uVar1],
                  (float)*(undefined8 *)(dst + uVar2) + l[uVar2] * fVar3 + fVar4 * -l[uVar1]);
  }
  return;
}

Assistant:

VECTORIZE void complex_multiply_add(float *restrict dst, float *restrict l, float *restrict r, uint32_t size){
  for(uint32_t k = 0; k < size; k+= 2){
    float reA = l[k+0];
    float imA = l[k+1];
    float reB = r[k+0];
    float imB = r[k+1];

    float re = reA * reB - imA * imB;
    float im = reA * imB + imA * reB;

    dst[k+0] += re;
    dst[k+1] += im;
  }
}